

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall kj::AutoCloseFd::~AutoCloseFd(AutoCloseFd *this)

{
  Type local_18;
  AutoCloseFd *local_10;
  AutoCloseFd *this_local;
  
  if (-1 < this->fd) {
    local_18.this = this;
    local_10 = this;
    UnwindDetector::catchExceptionsIfUnwinding<kj::AutoCloseFd::~AutoCloseFd()::__0>
              (&this->unwindDetector,&local_18);
  }
  return;
}

Assistant:

AutoCloseFd::~AutoCloseFd() noexcept(false) {
  if (fd >= 0) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // Don't use SYSCALL() here because close() should not be repeated on EINTR.
      if (miniposix::close(fd) < 0) {
        KJ_FAIL_SYSCALL("close", errno, fd) {
          break;
        }
      }
    });
  }
}